

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  string *targetName;
  uint uVar1;
  cmMakefile *this_00;
  int iVar2;
  char *pcVar3;
  char *__s2;
  long lVar4;
  pointer ppcVar5;
  _Hash_node_base *p_Var6;
  pointer ppcVar7;
  string fastTarget;
  string compiler;
  string make;
  char *in_stack_ffffffffffffff30;
  string local_b0;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_90;
  cmExtraSublimeTextGenerator *local_88;
  cmGeneratedFileStream *local_80;
  MapSourceFileFlags *local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_90 = lgs;
  local_88 = this;
  local_80 = fout;
  local_78 = sourceFileFlags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_MAKE_PROGRAM","");
  pcVar3 = cmMakefile::GetRequiredDefinition(mf,&local_70);
  std::__cxx11::string::string((string *)local_50,pcVar3,(allocator *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  if ((local_90->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (local_90->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"all","");
    AppendTarget(local_88,local_80,&local_b0,
                 *(local_90->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(cmTarget *)0x0,(char *)local_50[0],mf,
                 in_stack_ffffffffffffff30,local_78,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"clean","");
    AppendTarget(local_88,local_80,&local_b0,
                 *(local_90->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(cmTarget *)0x0,(char *)local_50[0],mf,
                 in_stack_ffffffffffffff30,local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    ppcVar7 = (local_90->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar5 = (local_90->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar7 != ppcVar5) {
      do {
        this_00 = (*ppcVar7)->Makefile;
        p_Var6 = (this_00->Targets)._M_h._M_before_begin._M_nxt;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          do {
            targetName = (string *)(p_Var6 + 1);
            uVar1 = *(uint *)&p_Var6[0x61]._M_nxt;
            if (uVar1 < 5) {
              AppendTarget(local_88,local_80,targetName,*ppcVar7,(cmTarget *)(p_Var6 + 5),
                           (char *)local_50[0],this_00,in_stack_ffffffffffffff30,local_78,false);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,p_Var6[1]._M_nxt,
                         (long)&(p_Var6[1]._M_nxt)->_M_nxt + (long)&(p_Var6[2]._M_nxt)->_M_nxt);
              std::__cxx11::string::append((char *)&local_b0);
              AppendTarget(local_88,local_80,&local_b0,*ppcVar7,(cmTarget *)(p_Var6 + 5),
                           (char *)local_50[0],this_00,in_stack_ffffffffffffff30,local_78,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else if (uVar1 == 5) {
              lVar4 = std::__cxx11::string::find((char *)targetName,0x50ec4c,0);
              if (((lVar4 != 0) ||
                  (iVar2 = std::__cxx11::string::compare((char *)targetName), iVar2 == 0)) &&
                 ((lVar4 = std::__cxx11::string::find((char *)targetName,0x50ec54,0), lVar4 != 0 ||
                  (iVar2 = std::__cxx11::string::compare((char *)targetName), iVar2 == 0)))) {
                lVar4 = std::__cxx11::string::find((char *)targetName,0x50ec5f,0);
                if (lVar4 == 0) {
                  iVar2 = std::__cxx11::string::compare((char *)targetName);
                  goto LAB_003c78cf;
                }
LAB_003c792a:
                AppendTarget(local_88,local_80,targetName,*ppcVar7,(cmTarget *)0x0,
                             (char *)local_50[0],this_00,in_stack_ffffffffffffff30,local_78,false);
              }
            }
            else if (uVar1 == 6) {
              pcVar3 = cmMakefile::GetCurrentBinaryDirectory(this_00);
              __s2 = cmMakefile::GetHomeOutputDirectory(this_00);
              iVar2 = strcmp(pcVar3,__s2);
LAB_003c78cf:
              if (iVar2 == 0) goto LAB_003c792a;
            }
            p_Var6 = p_Var6->_M_nxt;
          } while (p_Var6 != (_Hash_node_base *)0x0);
          ppcVar5 = (local_90->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 != ppcVar5);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::
  AppendAllTargets(const std::vector<cmLocalGenerator*>& lgs,
                   const cmMakefile* mf,
                   cmGeneratedFileStream& fout,
                   MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = "";
  if (!lgs.empty())
    {
      this->AppendTarget(fout, "all", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, true);
      this->AppendTarget(fout, "clean", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, false);
    }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, *lg, 0,
                               make.c_str(), makefile, compiler.c_str(),
                               sourceFileFlags, false);
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, *lg, 0,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          }
          break;
        default:
          break;
        }
      }
    }
}